

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O2

void orphanage_tests::MakeNewKeyWithFastRandomContext(CKey *key,FastRandomContext *rand_ctx)

{
  long lVar1;
  long in_FS_OFFSET;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> keydata;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  keydata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keydata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  keydata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,
             &rand_ctx->super_RandomMixin<FastRandomContext>,0x20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&keydata,&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  CKey::Set<unsigned_char*>
            (key,keydata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
             keydata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,true);
  if ((key->keydata)._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
      (array<unsigned_char,_32UL> *)0x0) {
    __assert_fail("key.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/orphanage_tests.cpp"
                  ,0x33,
                  "void orphanage_tests::MakeNewKeyWithFastRandomContext(CKey &, FastRandomContext &)"
                 );
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&keydata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void MakeNewKeyWithFastRandomContext(CKey& key, FastRandomContext& rand_ctx)
{
    std::vector<unsigned char> keydata;
    keydata = rand_ctx.randbytes(32);
    key.Set(keydata.data(), keydata.data() + keydata.size(), /*fCompressedIn=*/true);
    assert(key.IsValid());
}